

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adf.cpp
# Opt level: O0

bool ReadADF(MemFile *file,shared_ptr<Disk> *disk)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  element_type *peVar7;
  Data *data;
  size_t __nbytes;
  char *__stream;
  Format *local_4d0;
  ulong uStack_4b0;
  uint32_t prev;
  size_t i;
  uint32_t checksum;
  ADF_BOOTBLOCK *pbb;
  uint8_t bootblock [1024];
  Format fmtHD;
  Format fmtDD;
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  Format::Format((Format *)&fmtHD.gap3,AmigaDOS);
  Format::Format((Format *)(bootblock + 0x3f8),AmigaDOSHD);
  uVar2 = MemFile::size(file);
  uVar3 = Format::disk_size((Format *)&fmtHD.gap3);
  if (uVar2 != uVar3) {
    uVar2 = MemFile::size(file);
    uVar3 = Format::disk_size((Format *)(bootblock + 0x3f8));
    if (uVar2 != uVar3) {
      return false;
    }
  }
  __nbytes = (size_t)uVar3;
  bVar1 = MemFile::seek(file,0);
  if (bVar1) {
    __stream = (char *)&pbb;
    uVar6 = MemFile::read(file,(int)__stream,(void *)0x400,__nbytes);
    if ((uVar6 & 1) != 0) {
      uVar2 = util::betoh<unsigned_int>((uint)pbb);
      if ((uVar2 & 0xffffff00) != 0x444f5300) {
        return false;
      }
      i._4_4_ = 0;
      for (uStack_4b0 = 0; uStack_4b0 < 0x400; uStack_4b0 = uStack_4b0 + 4) {
        uVar2 = util::betoh<unsigned_int>(*(uint *)(bootblock + (uStack_4b0 - 8)));
        uVar2 = uVar2 + i._4_4_;
        bVar1 = uVar2 < i._4_4_;
        i._4_4_ = uVar2;
        if (bVar1) {
          i._4_4_ = uVar2 + 1;
        }
      }
      if (i._4_4_ != 0xffffffff) {
        __stream = "invalid AmigaDOS root block checksum";
        Message<>(msgWarning,"invalid AmigaDOS root block checksum");
      }
      MemFile::rewind(file,(FILE *)__stream);
      peVar7 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          disk);
      iVar4 = MemFile::size(file);
      iVar5 = Format::disk_size((Format *)&fmtHD.gap3);
      if (iVar4 == iVar5) {
        local_4d0 = (Format *)&fmtHD.gap3;
      }
      else {
        local_4d0 = (Format *)(bootblock + 0x3f8);
      }
      data = MemFile::data(file);
      Disk::format(peVar7,local_4d0,data,true);
      peVar7 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          disk);
      std::__cxx11::string::operator=((string *)&peVar7->strType,"ADF");
      return true;
    }
  }
  return false;
}

Assistant:

bool ReadADF(MemFile& file, std::shared_ptr<Disk>& disk)
{
    Format fmtDD{ RegularFormat::AmigaDOS };
    Format fmtHD{ RegularFormat::AmigaDOSHD };

    if (file.size() != fmtDD.disk_size() && file.size() != fmtHD.disk_size())
        return false;

    uint8_t bootblock[ADF_BOOTBLOCK_SIZE];
    auto pbb = reinterpret_cast<const ADF_BOOTBLOCK*>(bootblock);

    if (!file.seek(0) || !file.read(&bootblock, sizeof(bootblock)))
        return false;

    // Check for AmigaDOS signature
    if ((util::betoh(pbb->disk_type) & 0xffffff00) != 0x444f5300)
        return false;

    uint32_t checksum = 0;
    for (size_t i = 0; i < sizeof(bootblock); i += sizeof(uint32_t))
    {
        auto prev = checksum;

        checksum += util::betoh(*reinterpret_cast<uint32_t*>(bootblock + i));
        if (checksum < prev)
            checksum++;
    }

    if (~checksum)
        Message(msgWarning, "invalid AmigaDOS root block checksum");;

    file.rewind();
    disk->format(file.size() == fmtDD.disk_size() ? fmtDD : fmtHD, file.data(), true);
    disk->strType = "ADF";

    return true;
}